

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1decode.c
# Opt level: O0

void t1_decoder_done(T1_Decoder_conflict decoder)

{
  FT_Memory memory_00;
  FT_Memory memory;
  T1_Decoder_conflict decoder_local;
  
  memory_00 = (decoder->builder).memory;
  t1_builder_done(&decoder->builder);
  if ((decoder->cf2_instance).finalizer != (FT_Generic_Finalizer)0x0) {
    (*(decoder->cf2_instance).finalizer)((decoder->cf2_instance).data);
    ft_mem_free(memory_00,(decoder->cf2_instance).data);
    (decoder->cf2_instance).data = (void *)0x0;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  t1_decoder_done( T1_Decoder  decoder )
  {
    FT_Memory  memory = decoder->builder.memory;


    t1_builder_done( &decoder->builder );

    if ( decoder->cf2_instance.finalizer )
    {
      decoder->cf2_instance.finalizer( decoder->cf2_instance.data );
      FT_FREE( decoder->cf2_instance.data );
    }
  }